

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

void __thiscall
wallet::CWallet::CommitTransaction
          (CWallet *this,CTransactionRef *tx,mapValue_t *mapValue,
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *orderForm)

{
  long lVar1;
  string_view suffix;
  string_view str;
  bool bVar2;
  CWalletTx *pCVar3;
  runtime_error *this_00;
  mapped_type *pmVar4;
  ConstevalFormatString<1U> in_RDX;
  long in_RDI;
  long in_FS_OFFSET;
  CWalletTx *coin;
  CTxIn *txin;
  vector<CTxIn,_std::allocator<CTxIn>_> *__range1;
  CWalletTx *wtx;
  const_iterator __end1;
  const_iterator __begin1;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock49;
  string err_string;
  undefined4 in_stack_fffffffffffffd98;
  ChangeType in_stack_fffffffffffffd9c;
  anon_class_16_2_f5731128 *in_stack_fffffffffffffda0;
  undefined7 in_stack_fffffffffffffda8;
  undefined1 in_stack_fffffffffffffdaf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb8;
  char *in_stack_fffffffffffffdc0;
  undefined7 in_stack_fffffffffffffdc8;
  undefined1 in_stack_fffffffffffffdcf;
  string *in_stack_fffffffffffffdd0;
  CWalletTx *in_stack_fffffffffffffdd8;
  CWallet *in_stack_fffffffffffffde0;
  CWallet *in_stack_fffffffffffffde8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  CTransaction *in_stack_fffffffffffffe10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_131 [2];
  string_view local_d8;
  string local_78 [30];
  undefined1 in_stack_ffffffffffffffa6;
  undefined1 in_stack_ffffffffffffffa7;
  UpdateWalletTxFn *in_stack_ffffffffffffffa8;
  TxState *in_stack_ffffffffffffffb0;
  CTransactionRef *in_stack_ffffffffffffffb8;
  CWallet *in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)
             CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffdd8,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffdd0,
             (char *)CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8),
             in_stack_fffffffffffffdc0,(int)((ulong)in_stack_fffffffffffffdb8 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffdb8 >> 0x18,0));
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
  CTransaction::ToString_abi_cxx11_(in_stack_fffffffffffffe10);
  std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffdb8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffdb8,
             (char *)in_stack_fffffffffffffdb0);
  str._M_str = (char *)in_stack_fffffffffffffdd8;
  str._M_len = (size_t)in_stack_fffffffffffffdd0;
  suffix._M_str._0_7_ = in_stack_fffffffffffffdc8;
  suffix._M_len = (size_t)in_stack_fffffffffffffdc0;
  suffix._M_str._7_1_ = in_stack_fffffffffffffdcf;
  local_d8 = util::RemoveSuffixView(str,suffix);
  WalletLogPrintf<std::basic_string_view<char,std::char_traits<char>>>
            (in_stack_fffffffffffffde8,in_RDX,
             (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffde0);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)
             CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
             (shared_ptr<const_CTransaction> *)0xae5652);
  TxStateInactive::TxStateInactive
            ((TxStateInactive *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),false)
  ;
  std::
  variant<wallet::TxStateConfirmed,wallet::TxStateInMempool,wallet::TxStateBlockConflicted,wallet::TxStateInactive,wallet::TxStateUnrecognized>
  ::variant<wallet::TxStateInactive,void,void,wallet::TxStateInactive,void>
            ((variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
              *)CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8),
             (TxStateInactive *)in_stack_fffffffffffffda0);
  std::function<bool(wallet::CWalletTx&,bool)>::
  function<wallet::CWallet::CommitTransaction(std::shared_ptr<CTransaction_const>,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>,std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>)::__0,void>
            ((function<bool_(wallet::CWalletTx_&,_bool)> *)
             CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8),in_stack_fffffffffffffda0
            );
  pCVar3 = AddToWallet(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0
                       ,in_stack_ffffffffffffffa8,(bool)in_stack_ffffffffffffffa7,
                       (bool)in_stack_ffffffffffffffa6);
  std::function<bool_(wallet::CWalletTx_&,_bool)>::~function
            ((function<bool_(wallet::CWalletTx_&,_bool)> *)
             CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
  std::shared_ptr<const_CTransaction>::~shared_ptr
            ((shared_ptr<const_CTransaction> *)
             CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
  if (pCVar3 == (CWalletTx *)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    this_01 = local_131;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_01,(char *)this_00,(allocator<char> *)in_stack_fffffffffffffdd8);
    std::operator+(in_stack_fffffffffffffdb0,
                   (char *)CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8));
    std::runtime_error::runtime_error(this_00,local_78);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
    std::vector<CTxIn,_std::allocator<CTxIn>_>::begin
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffffda0);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::end
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffffda0);
    while( true ) {
      bVar2 = __gnu_cxx::operator==<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                        ((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                          *)CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8),
                         (__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                          *)in_stack_fffffffffffffda0);
      if (((bVar2 ^ 0xffU) & 1) == 0) break;
      __gnu_cxx::__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
      operator*((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
                CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
      in_stack_fffffffffffffdd0 = (string *)(in_RDI + 0x248);
      in_stack_fffffffffffffdd8 =
           (CWalletTx *)
           transaction_identifier::operator_cast_to_uint256_
                     ((transaction_identifier<false> *)
                      CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
      pmVar4 = std::
               unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
               ::at((unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
                     *)CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8),
                    (key_type *)in_stack_fffffffffffffda0);
      in_stack_fffffffffffffdcf = (undefined1)((ulong)pmVar4 >> 0x38);
      CWalletTx::MarkDirty
                ((CWalletTx *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
      CWalletTx::GetHash((CWalletTx *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98))
      ;
      in_stack_fffffffffffffdb0 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           transaction_identifier::operator_cast_to_uint256_
                     ((transaction_identifier<false> *)
                      CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
      boost::signals2::
      signal<void_(const_uint256_&,_ChangeType),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_uint256_&,_ChangeType)>,_boost::function<void_(const_boost::signals2::connection_&,_const_uint256_&,_ChangeType)>,_boost::signals2::mutex>
      ::operator()((signal<void_(const_uint256_&,_ChangeType),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_uint256_&,_ChangeType)>,_boost::function<void_(const_boost::signals2::connection_&,_const_uint256_&,_ChangeType)>,_boost::signals2::mutex>
                    *)CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8),
                   (uint256 *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c);
      __gnu_cxx::__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
      operator++((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
                 CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
    }
    if ((*(byte *)(in_RDI + 0x50) & 1) != 0) {
      std::__cxx11::string::string(in_stack_fffffffffffffdb0);
      bVar2 = SubmitTxMemoryPoolAndRelay
                        (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                         in_stack_fffffffffffffdd0,(bool)in_stack_fffffffffffffdcf);
      if (!bVar2) {
        WalletLogPrintf<std::__cxx11::string>
                  (in_stack_fffffffffffffde8,in_RDX,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffde0);
      }
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
    }
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
               CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void CWallet::CommitTransaction(CTransactionRef tx, mapValue_t mapValue, std::vector<std::pair<std::string, std::string>> orderForm)
{
    LOCK(cs_wallet);
    WalletLogPrintf("CommitTransaction:\n%s\n", util::RemoveSuffixView(tx->ToString(), "\n"));

    // Add tx to wallet, because if it has change it's also ours,
    // otherwise just for transaction history.
    CWalletTx* wtx = AddToWallet(tx, TxStateInactive{}, [&](CWalletTx& wtx, bool new_tx) {
        CHECK_NONFATAL(wtx.mapValue.empty());
        CHECK_NONFATAL(wtx.vOrderForm.empty());
        wtx.mapValue = std::move(mapValue);
        wtx.vOrderForm = std::move(orderForm);
        wtx.fTimeReceivedIsTxTime = true;
        wtx.fFromMe = true;
        return true;
    });

    // wtx can only be null if the db write failed.
    if (!wtx) {
        throw std::runtime_error(std::string(__func__) + ": Wallet db error, transaction commit failed");
    }

    // Notify that old coins are spent
    for (const CTxIn& txin : tx->vin) {
        CWalletTx &coin = mapWallet.at(txin.prevout.hash);
        coin.MarkDirty();
        NotifyTransactionChanged(coin.GetHash(), CT_UPDATED);
    }

    if (!fBroadcastTransactions) {
        // Don't submit tx to the mempool
        return;
    }

    std::string err_string;
    if (!SubmitTxMemoryPoolAndRelay(*wtx, err_string, true)) {
        WalletLogPrintf("CommitTransaction(): Transaction cannot be broadcast immediately, %s\n", err_string);
        // TODO: if we expect the failure to be long term or permanent, instead delete wtx from the wallet and return failure.
    }
}